

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O3

void __thiscall
ConfidentialTxIn_RemovePeginWitnessStackAll_Test::~ConfidentialTxIn_RemovePeginWitnessStackAll_Test
          (ConfidentialTxIn_RemovePeginWitnessStackAll_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConfidentialTxIn, RemovePeginWitnessStackAll) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_NO_THROW((txin.RemovePeginWitnessStackAll()));
  EXPECT_EQ(txin.GetPeginWitnessStackNum(), 0);
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "17f0c9b759a09c56116151cca94f18340acc3a782b2062cee3c41333b2dc63fe");
}